

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_text_read.cpp
# Opt level: O0

string * __thiscall
ritobin::io::read_text_abi_cxx11_
          (string *__return_storage_ptr__,io *this,FieldList *list,
          span<const_char,_18446744073709551615UL> data)

{
  bool bVar1;
  pointer pcVar2;
  pointer pcVar3;
  size_type sVar4;
  char **this_00;
  undefined1 local_68 [8];
  BinTextReader reader;
  pointer end;
  pointer begin;
  FieldList *list_local;
  span<const_char,_18446744073709551615UL> data_local;
  
  data_local._M_ptr = data._M_ptr;
  list_local = list;
  data_local._M_extent._M_extent_value = (size_t)__return_storage_ptr__;
  pcVar2 = std::span<const_char,_18446744073709551615UL>::data
                     ((span<const_char,_18446744073709551615UL> *)&list_local);
  pcVar3 = std::span<const_char,_18446744073709551615UL>::data
                     ((span<const_char,_18446744073709551615UL> *)&list_local);
  sVar4 = std::span<const_char,_18446744073709551615UL>::size
                    ((span<const_char,_18446744073709551615UL> *)&list_local);
  reader.reader.cur_ = pcVar3 + sVar4;
  this_00 = &reader.reader.cap_;
  local_68 = (undefined1  [8])pcVar2;
  reader.reader.beg_ = pcVar2;
  reader.error.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)reader.reader.cur_;
  memset(this_00,0,0x18);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
            *)this_00);
  bVar1 = impl_text_read::BinTextReader::process_list_fields
                    ((BinTextReader *)local_68,(FieldList *)this);
  if (bVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    impl_text_read::BinTextReader::trace_error_abi_cxx11_
              (__return_storage_ptr__,(BinTextReader *)local_68);
  }
  impl_text_read::BinTextReader::~BinTextReader((BinTextReader *)local_68);
  return __return_storage_ptr__;
}

Assistant:

std::string read_text(FieldList& list, std::span<char const> data) noexcept {
        auto const begin = data.data();
        auto const end = data.data() + data.size();
        BinTextReader reader = { { begin, begin, end }, {} };
        if (!reader.process_list_fields(list)) {
            return reader.trace_error();
        }
        return {};
    }